

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

ggml_backend_buffer_type_t ggml_backend_cpu_aarch64_buffer_type(void)

{
  int iVar1;
  ggml_backend_reg_t pgVar2;
  void *__s;
  ggml_backend_dev_t this;
  
  if (ggml_backend_cpu_aarch64_buffer_type()::ggml_backend_cpu_buffer_type_aarch64 == '\0') {
    iVar1 = __cxa_guard_acquire(&ggml_backend_cpu_aarch64_buffer_type()::
                                 ggml_backend_cpu_buffer_type_aarch64);
    if (iVar1 != 0) {
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.get_name =
           ggml_backend_cpu_aarch64_buffer_type_get_name;
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.alloc_buffer
           = ggml_backend_cpu_aarch64_buffer_type_alloc_buffer;
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.get_alignment
           = ggml_backend_cpu_aarch64_buffer_type_get_alignment;
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.get_max_size
           = (_func_size_t_ggml_backend_buffer_type_t *)0x0;
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.
      get_alloc_size = (_func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *)0x0;
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.iface.is_host =
           (_func__Bool_ggml_backend_buffer_type_t *)0x0;
      pgVar2 = ggml_backend_cpu_reg();
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.device =
           (ggml_backend_dev_t)ggml_backend_reg_dev_get(pgVar2);
      this = ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.device;
      __s = operator_new(8);
      memset(__s,0,8);
      ggml::cpu::aarch64::extra_buffer_type::extra_buffer_type((extra_buffer_type *)this);
      ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64.context = __s;
      __cxa_guard_release(&ggml_backend_cpu_aarch64_buffer_type()::
                           ggml_backend_cpu_buffer_type_aarch64);
    }
  }
  return &ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64;
}

Assistant:

ggml_backend_buffer_type_t ggml_backend_cpu_aarch64_buffer_type(void) {
    static struct ggml_backend_buffer_type ggml_backend_cpu_buffer_type_aarch64 = {
        /* .iface    = */ {
                           /* .get_name         = */ ggml_backend_cpu_aarch64_buffer_type_get_name,
                           /* .alloc_buffer     = */ ggml_backend_cpu_aarch64_buffer_type_alloc_buffer,
                           /* .get_alignment    = */ ggml_backend_cpu_aarch64_buffer_type_get_alignment,
                           /* .get_max_size     = */ nullptr,  // defaults to SIZE_MAX
                           /* .get_alloc_size   = */ nullptr,  // defaults to ggml_nbytes
                           /* .is_host          = */ nullptr,
                           },
        /* .device  = */ ggml_backend_reg_dev_get(ggml_backend_cpu_reg(), 0),
        /* .context = */ new ggml::cpu::aarch64::extra_buffer_type(),
    };

    return &ggml_backend_cpu_buffer_type_aarch64;
}